

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

int smf::MidiFile::ticksearch(void *A,void *B)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*B <= *A) {
    uVar1 = (uint)(*B < *A);
  }
  return uVar1;
}

Assistant:

int MidiFile::ticksearch(const void* A, const void* B) {
	_TickTime& a = *((_TickTime*)A);
	_TickTime& b = *((_TickTime*)B);

	if (a.tick < b.tick) {
		return -1;
	} else if (a.tick > b.tick) {
		return 1;
	}
	return 0;
}